

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfFunction.h
# Opt level: O0

void __thiscall
halfFunction<half>::halfFunction<half(*)(half)>
          (halfFunction<half> *this,_func_half_half *f,half domainMin,half domainMax,
          half defaultValue,half posInfValue,half negInfValue,half nanValue)

{
  bool bVar1;
  undefined2 uVar2;
  void *pvVar3;
  code *in_RSI;
  long *in_RDI;
  undefined2 in_R8W;
  float fVar4;
  float fVar5;
  undefined2 in_stack_00000010;
  half x;
  int i;
  undefined2 *local_40;
  half local_26;
  int local_24;
  code *local_20;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  half local_4;
  half local_2;
  
  local_c = in_stack_00000010;
  local_20 = in_RSI;
  local_6 = in_R8W;
  pvVar3 = operator_new__(0x20000);
  *in_RDI = (long)pvVar3;
  local_24 = 0;
  do {
    if (0xffff < local_24) {
      return;
    }
    half::setBits(&local_26,(unsigned_short)local_24);
    bVar1 = half::isNan(&local_26);
    if (bVar1) {
      *(undefined2 *)(*in_RDI + (long)local_24 * 2) = local_c;
    }
    else {
      bVar1 = half::isInfinity(&local_26);
      if (bVar1) {
        bVar1 = half::isNegative(&local_26);
        if (bVar1) {
          local_40 = &local_a;
        }
        else {
          local_40 = &local_8;
        }
        *(undefined2 *)(*in_RDI + (long)local_24 * 2) = *local_40;
      }
      else {
        fVar4 = half::operator_cast_to_float(&local_26);
        fVar5 = half::operator_cast_to_float(&local_2);
        if (fVar5 <= fVar4) {
          fVar4 = half::operator_cast_to_float(&local_26);
          fVar5 = half::operator_cast_to_float(&local_4);
          if (fVar4 <= fVar5) {
            uVar2 = (*local_20)(local_26._h);
            *(undefined2 *)(*in_RDI + (long)local_24 * 2) = uVar2;
            goto LAB_001b6bd9;
          }
        }
        *(undefined2 *)(*in_RDI + (long)local_24 * 2) = local_6;
      }
    }
LAB_001b6bd9:
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

halfFunction<T>::halfFunction (Function f,
			       half domainMin,
			       half domainMax,
			       T defaultValue,
			       T posInfValue,
			       T negInfValue,
			       T nanValue)
{
#ifndef ILMBASE_HAVE_LARGE_STACK
    _lut = new T[1<<16];
#endif
    
    for (int i = 0; i < (1 << 16); i++)
    {
	half x;
	x.setBits (i);

	if (x.isNan())
	    _lut[i] = nanValue;
	else if (x.isInfinity())
	    _lut[i] = x.isNegative()? negInfValue: posInfValue;
	else if (x < domainMin || x > domainMax)
	    _lut[i] = defaultValue;
	else
	    _lut[i] = f (x);
    }
}